

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAPropBag.cpp
# Opt level: O2

HRESULT __thiscall Js::SCAPropBag::QueryInterface(SCAPropBag *this,IID *riid,void **ppv)

{
  int iVar1;
  HRESULT HVar2;
  
  if (ppv != (void **)0x0) {
    iVar1 = IsEqualGUID(riid,&IID_IUnknown);
    if (iVar1 == 0) {
      *ppv = (void *)0x0;
      HVar2 = -0x7fffbffe;
    }
    else {
      *ppv = this;
      AddRef(this);
      HVar2 = 0;
    }
    return HVar2;
  }
  return -0x7fffbffd;
}

Assistant:

STDMETHODIMP SCAPropBag::QueryInterface(REFIID riid, void** ppv)
    {
        if (ppv == nullptr)
        {
            return E_POINTER;
        }

        if (IsEqualGUID(riid, IID_IUnknown))
        {
            *ppv = static_cast<IUnknown*>(this);
            AddRef();
            return S_OK;
        }

        *ppv = nullptr;
        return E_NOINTERFACE;
    }